

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip.c
# Opt level: O3

void write_contents(archive *a)

{
  int iVar1;
  mode_t mVar2;
  archive_entry *paVar3;
  la_ssize_t lVar4;
  time_t v2;
  long v2_00;
  char *pcVar5;
  la_int64_t lVar6;
  
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'7',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname(paVar3,"file");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,8);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'<',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'>',8,"8",lVar4,"archive_write_data(a, \"12345678\", 9)",(void *)0x0);
  lVar4 = archive_write_data(a,"1",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'?',0,"0",lVar4,"archive_write_data(a, \"1\", 1)",(void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'D',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname(paVar3,"file2");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,4);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"1234",4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'K',4,"4",lVar4,"archive_write_data(a, \"1234\", 4)",(void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'P',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_mtime(paVar3,2,0xf);
  archive_entry_copy_pathname(paVar3,"file3");
  archive_entry_set_mode(paVar3,0x8191);
  archive_entry_unset_size(paVar3);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"mnopq",5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'W',5,"5",lVar4,"archive_write_data(a, \"mnopq\", 5)",(void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'\\',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  v2 = archive_entry_mtime(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'^',1,"1",v2,"archive_entry_mtime(ae)",(void *)0x0);
  v2_00 = archive_entry_mtime_nsec(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'_',10,"10",v2_00,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"symlink");
  pcVar5 = archive_entry_pathname(paVar3);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'a',"symlink","\"symlink\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_copy_symlink(paVar3,"file1");
  pcVar5 = archive_entry_symlink(paVar3);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'c',"file1","\"file1\"",pcVar5,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(paVar3,0xa1ed);
  mVar2 = archive_entry_mode(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'e',0xa1ed,"(AE_IFLNK | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(paVar3,4);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'h',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'n',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_mtime(paVar3,0xb,0x6e);
  archive_entry_copy_pathname(paVar3,"dir");
  archive_entry_set_mode(paVar3,0x41ed);
  archive_entry_set_size(paVar3,0x200);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",a);
  failure("size should be zero so that applications know not to write");
  lVar6 = archive_entry_size(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'u',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'w',0,"0",lVar4,"archive_write_data(a, \"12345678\", 9)",a);
  iVar1 = archive_write_zip_set_compression_deflate(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'}',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_zip_set_compression_deflate(a)",a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'\x82',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname(paVar3,"file_deflate");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,8);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'\x89',8,"8",lVar4,"archive_write_data(a, \"12345678\", 9)",(void *)0x0);
  lVar4 = archive_write_data(a,"1",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'\x8a',0,"0",lVar4,"archive_write_data(a, \"1\", 1)",(void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'\x8f',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname(paVar3,"file2_deflate");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,4);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'\x94',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"1234",4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'\x96',4,"4",lVar4,"archive_write_data(a, \"1234\", 4)",(void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'\x9b',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,2,0xf);
  archive_entry_copy_pathname(paVar3,"file3_deflate");
  archive_entry_set_mode(paVar3,0x8191);
  archive_entry_unset_size(paVar3);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'\xa0',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0)
  ;
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"ghijk",5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'¢',5,"5",lVar4,"archive_write_data(a, \"ghijk\", 5)",(void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'§',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname(paVar3,"symlink_deflate");
  archive_entry_copy_symlink(paVar3,"file1");
  archive_entry_set_mode(paVar3,0xa1ed);
  archive_entry_set_size(paVar3,4);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'­',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'³',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,0xb,0x6e);
  archive_entry_copy_pathname(paVar3,"dir_deflate");
  archive_entry_set_mode(paVar3,0x41ed);
  archive_entry_set_size(paVar3,0x200);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'¸',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",a);
  failure("size should be zero so that applications know not to write");
  lVar6 = archive_entry_size(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'º',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'¼',0,"0",lVar4,"archive_write_data(a, \"12345678\", 9)",a);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'½',0,"ARCHIVE_OK",(long)iVar1,"archive_write_finish_entry(a)",a);
  iVar1 = archive_write_zip_set_compression_store(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ã',0,"ARCHIVE_OK",(long)iVar1,"archive_write_zip_set_compression_store(a)"
                      ,a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'È',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname(paVar3,"file_stored");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,8);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Í',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ï',8,"8",lVar4,"archive_write_data(a, \"12345678\", 9)",(void *)0x0);
  lVar4 = archive_write_data(a,"1",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ð',0,"0",lVar4,"archive_write_data(a, \"1\", 1)",(void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'Õ',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname(paVar3,"file2_stored");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,4);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ú',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"ACEG",4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ü',4,"4",lVar4,"archive_write_data(a, \"ACEG\", 4)",(void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'á',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,2,0xf);
  archive_entry_copy_pathname(paVar3,"file3_stored");
  archive_entry_set_mode(paVar3,0x8191);
  archive_entry_unset_size(paVar3);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'æ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"ijklm",5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'è',5,"5",lVar4,"archive_write_data(a, \"ijklm\", 5)",(void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'í',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_copy_pathname(paVar3,"symlink_stored");
  archive_entry_copy_symlink(paVar3,"file1");
  archive_entry_set_mode(paVar3,0xa1ed);
  archive_entry_set_size(paVar3,4);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ó',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'ù',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,0xb,0x6e);
  archive_entry_copy_pathname(paVar3,"dir_stored");
  archive_entry_set_mode(paVar3,0x41ed);
  archive_entry_set_size(paVar3,0x200);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'þ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",a);
  failure("size should be zero so that applications know not to write");
  lVar6 = archive_entry_size(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ā',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(a,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ă',0,"0",lVar4,"archive_write_data(a, \"12345678\", 9)",a);
  iVar1 = archive_write_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ć',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ć',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
write_contents(struct archive *a)
{
	struct archive_entry *ae;

	/*
	 * First write things with the "default" compression.
	 * The library will choose "deflate" for most things if it's
	 * available, else "store".
	 */

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 9));
	assertEqualInt(0, archive_write_data(a, "1", 1));

	/*
	 * Write another file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(4, archive_write_data(a, "1234", 4));

	/*
	 * Write a file with an unknown size.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 2, 15);
	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mode(ae, AE_IFREG | 0621);
	archive_entry_unset_size(ae);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(5, archive_write_data(a, "mnopq", 5));

	/*
	 * Write symbolic link.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_copy_pathname(ae, "symlink");
	assertEqualString("symlink", archive_entry_pathname(ae));
	archive_entry_copy_symlink(ae, "file1");
	assertEqualString("file1", archive_entry_symlink(ae));
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	assertEqualInt((AE_IFLNK | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 4);

	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 110);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	archive_entry_set_size(ae, 512);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("size should be zero so that applications know not to write");
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));

	/*
	 * Force "deflate" compression if the platform supports it.
	 */
#ifdef HAVE_ZLIB_H
	assertEqualIntA(a, ARCHIVE_OK, archive_write_zip_set_compression_deflate(a));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file_deflate");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 9));
	assertEqualInt(0, archive_write_data(a, "1", 1));

	/*
	 * Write another file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file2_deflate");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(4, archive_write_data(a, "1234", 4));

	/*
	 * Write a file with an unknown size.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 2, 15);
	archive_entry_copy_pathname(ae, "file3_deflate");
	archive_entry_set_mode(ae, AE_IFREG | 0621);
	archive_entry_unset_size(ae);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(5, archive_write_data(a, "ghijk", 5));

	/*
	 * Write symbolic like file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "symlink_deflate");
	archive_entry_copy_symlink(ae, "file1");
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 110);
	archive_entry_copy_pathname(ae, "dir_deflate");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	archive_entry_set_size(ae, 512);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("size should be zero so that applications know not to write");
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_finish_entry(a));
#endif

	/*
	 * Now write a bunch of entries with "store" compression.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_zip_set_compression_store(a));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file_stored");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 9));
	assertEqualInt(0, archive_write_data(a, "1", 1));

	/*
	 * Write another file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "file2_stored");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(4, archive_write_data(a, "ACEG", 4));

	/*
	 * Write a file with an unknown size.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 2, 15);
	archive_entry_copy_pathname(ae, "file3_stored");
	archive_entry_set_mode(ae, AE_IFREG | 0621);
	archive_entry_unset_size(ae);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(5, archive_write_data(a, "ijklm", 5));

	/*
	 * Write symbolic like file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	archive_entry_copy_pathname(ae, "symlink_stored");
	archive_entry_copy_symlink(ae, "file1");
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	archive_entry_set_size(ae, 4);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write a directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 110);
	archive_entry_copy_pathname(ae, "dir_stored");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	archive_entry_set_size(ae, 512);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	failure("size should be zero so that applications know not to write");
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));


	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
}